

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O3

t_soundfile_type * soundfile_findtype(char *name)

{
  t_soundfile_type *ptVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = sf_numtypes * 8;
  lVar3 = 0;
  do {
    ptVar1 = *(t_soundfile_type **)((long)sf_types + lVar3);
    iVar2 = strcmp(name,ptVar1->t_name);
    if (iVar2 == 0) {
      return ptVar1;
    }
    lVar3 = lVar3 + 8;
  } while (lVar4 != lVar3);
  return (t_soundfile_type *)0x0;
}

Assistant:

static t_soundfile_type *soundfile_findtype(const char *name)
{
    t_soundfile_type **t = soundfile_firsttype();
    while (t)
    {
        if (!strcmp(name, (*t)->t_name))
            break;
        t = soundfile_nexttype(t);
    }
    return (t ? *t : NULL);
}